

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O0

vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
* __thiscall
optimization::loop_unrolling::Rewriter::get_insts(Rewriter *this,int times,VarId *new_change_var)

{
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  size_type sVar4;
  type pIVar5;
  size_type sVar6;
  int in_EDX;
  long in_RSI;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<VarId,_VarId>_&>::value,_pair<iterator,_bool>_>
  _Var7;
  PhiInst *phi_1;
  Inst *i_3;
  value_type *inst_2;
  OpInst *opist;
  Inst *i_2;
  VarId var;
  iterator __end5;
  iterator __begin5;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range5;
  bool flag;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> ptr_1;
  PhiInst *phi;
  Inst *i_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> ptr;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3;
  int i;
  VarId cond;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *res;
  undefined4 in_stack_fffffffffffffd08;
  uint32_t in_stack_fffffffffffffd0c;
  VarId *in_stack_fffffffffffffd10;
  uint32_t *this_00;
  pair<mir::inst::VarId,_mir::inst::VarId> *in_stack_fffffffffffffd18;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  in_stack_fffffffffffffd20;
  const_iterator in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  long local_2c8;
  iterator in_stack_fffffffffffffdd0;
  Rewriter *in_stack_fffffffffffffdd8;
  long local_218;
  undefined1 local_180 [16];
  undefined1 local_170 [32];
  _Self local_150;
  _Self local_148;
  undefined1 local_140 [48];
  undefined1 *local_110;
  byte local_101;
  VarId *local_f8;
  VarId *local_f0;
  VarId *local_e8;
  VarId *local_e0;
  long local_d0;
  type local_c8;
  reference local_b8;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_b0;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_a8;
  long local_a0;
  reference local_78;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_70;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_68;
  long local_60;
  _Base_ptr local_58;
  undefined1 local_50;
  int local_48;
  undefined1 local_21;
  int local_14;
  
  local_21 = 0;
  local_14 = in_EDX;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)0x1f1546);
  mir::inst::VarId::VarId(in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
  for (local_48 = 0; local_48 < local_14; local_48 = local_48 + 1) {
    std::
    map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
    ::clear((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             *)0x1f1587);
    if (local_48 != 0) {
      _Var7 = std::
              map<mir::inst::VarId,mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
              ::insert<std::pair<mir::inst::VarId,mir::inst::VarId>&>
                        ((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                          *)in_stack_fffffffffffffd20._M_current,in_stack_fffffffffffffd18);
      local_58 = (_Base_ptr)_Var7.first._M_node;
      local_50 = _Var7.second;
    }
    local_60 = *(long *)(in_RSI + 8) + 0x40;
    local_68._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    local_70 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffd10,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)),
          bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_68);
      pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x1f1675);
      iVar2 = (*(pIVar3->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 != 4) {
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1f16a3);
        mir::inst::VarId::VarId
                  (in_stack_fffffffffffffd10,
                   (VarId *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        copy_var(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0._M_current);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_68);
    }
    local_a0 = *(long *)(in_RSI + 8) + 0x40;
    local_a8._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    local_b0 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffd10,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)),
          bVar1) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_a8);
      pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x1f1776);
      iVar2 = (*(pIVar3->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 7) {
        if (local_48 == 0) {
          pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                   operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                              0x1f17b6);
          (*(pIVar3->super_Displayable)._vptr_Displayable[6])();
          std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
          unique_ptr<std::default_delete<mir::inst::Inst>,void>
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     in_stack_fffffffffffffd10,
                     (pointer)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          local_c8 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )in_stack_fffffffffffffd10);
          if (local_c8 == (type)0x0) {
            local_218 = 0;
          }
          else {
            local_218 = __dynamic_cast(local_c8,&mir::inst::Inst::typeinfo,
                                       &mir::inst::PhiInst::typeinfo,0);
          }
          local_d0 = local_218;
          in_stack_fffffffffffffdd8 = (Rewriter *)(local_218 + 0x28);
          local_e8 = (VarId *)std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              begin((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          local_f0 = (VarId *)std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                                        ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)CONCAT44(in_stack_fffffffffffffd0c,
                                                     in_stack_fffffffffffffd08));
          local_e0 = (VarId *)std::
                              find<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,mir::inst::VarId>
                                        (in_stack_fffffffffffffd28._M_current,
                                         in_stack_fffffffffffffd20,&in_stack_fffffffffffffd18->first
                                        );
          __gnu_cxx::
          __normal_iterator<mir::inst::VarId_const*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>
          ::__normal_iterator<mir::inst::VarId*>
                    ((__normal_iterator<const_mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                      *)in_stack_fffffffffffffd10,
                     (__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          in_stack_fffffffffffffdd0 =
               std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::erase
                         (in_stack_fffffffffffffd20._M_current,in_stack_fffffffffffffd28);
          local_f8 = in_stack_fffffffffffffdd0._M_current;
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1f196b)
          ;
          std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28._M_current);
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1f199e)
          ;
          mir::inst::VarId::operator=
                    (in_stack_fffffffffffffd10,
                     (VarId *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffffd10,
                      (value_type *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     in_stack_fffffffffffffd20._M_current);
        }
      }
      else {
        pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1f19e8);
        (*(pIVar3->super_Displayable)._vptr_Displayable[6])();
        std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
        unique_ptr<std::default_delete<mir::inst::Inst>,void>
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   in_stack_fffffffffffffd10,
                   (pointer)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1f1a28);
        local_101 = mir::inst::VarId::operator==(&pIVar3->dest,(VarId *)(in_RSI + 0x60));
        pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1f1a54);
        (*(pIVar3->super_Displayable)._vptr_Displayable[2])(local_140);
        local_110 = local_140;
        local_148._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        local_150._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        while (bVar1 = std::operator!=(&local_148,&local_150), bVar1) {
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1f1af5);
          mir::inst::VarId::VarId
                    (in_stack_fffffffffffffd10,
                     (VarId *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          sVar4 = std::
                  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                           *)in_stack_fffffffffffffd20._M_current,&in_stack_fffffffffffffd18->first)
          ;
          if (sVar4 != 0) {
            pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)0x1f1b4f);
            mir::inst::VarId::VarId
                      (in_stack_fffffffffffffd10,
                       (VarId *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            std::
            map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
            ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 in_stack_fffffffffffffd28._M_current);
            mir::inst::VarId::VarId
                      (in_stack_fffffffffffffd10,
                       (VarId *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            (*(pIVar3->super_Displayable)._vptr_Displayable[3])(pIVar3,local_170,local_180);
          }
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffffd10);
        }
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1f1aca);
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1f1c25);
        sVar4 = std::
                map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                         *)in_stack_fffffffffffffd20._M_current,&in_stack_fffffffffffffd18->first);
        if (sVar4 != 0) {
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1f1c66)
          ;
          std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28._M_current);
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1f1c8b)
          ;
          mir::inst::VarId::operator=
                    (in_stack_fffffffffffffd10,
                     (VarId *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        }
        if ((local_101 & 1) != 0) {
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1f1cb3)
          ;
          mir::inst::VarId::operator=
                    (in_stack_fffffffffffffd10,
                     (VarId *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1f1cd4)
          ;
          mir::inst::VarId::operator=
                    (in_stack_fffffffffffffd10,
                     (VarId *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        }
        pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1f1cfd);
        iVar2 = (*(pIVar3->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 == 1) {
          pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                   operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             in_stack_fffffffffffffd10);
          if (pIVar5 == (type)0x0) {
            local_2c8 = 0;
          }
          else {
            local_2c8 = __dynamic_cast(pIVar5,&mir::inst::Inst::typeinfo,
                                       &mir::inst::OpInst::typeinfo,0);
          }
          if (*(int *)(local_2c8 + 0x58) == 7) {
            std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                      ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       0x1f1da4);
            mir::inst::VarId::operator=
                      (in_stack_fffffffffffffd10,
                       (VarId *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          }
        }
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)in_stack_fffffffffffffd10,
                    (value_type *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   in_stack_fffffffffffffd20._M_current);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_a8);
    }
  }
  sVar6 = std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::size(in_RDI);
  if (sVar6 != 0) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::front((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)in_stack_fffffffffffffd10);
    pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        0x1f1e57);
    iVar2 = (*(pIVar3->super_Displayable)._vptr_Displayable[1])();
    if (iVar2 != 7) {
      __assert_fail("inst->inst_kind() == mir::inst::InstKind::Phi",
                    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
                    ,0x5d,
                    "std::vector<std::unique_ptr<mir::inst::Inst>> optimization::loop_unrolling::Rewriter::get_insts(int, mir::inst::VarId &)"
                   );
    }
    in_stack_fffffffffffffd20._M_current =
         (VarId *)std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                            (in_stack_fffffffffffffd10);
    if ((type)in_stack_fffffffffffffd20._M_current == (type)0x0) {
      in_stack_fffffffffffffd18 = (pair<mir::inst::VarId,_mir::inst::VarId> *)0x0;
    }
    else {
      in_stack_fffffffffffffd18 =
           (pair<mir::inst::VarId,_mir::inst::VarId> *)
           __dynamic_cast(in_stack_fffffffffffffd20._M_current,&mir::inst::Inst::typeinfo,
                          &mir::inst::PhiInst::typeinfo,0);
    }
    this_00 = &in_stack_fffffffffffffd18[1].first.id;
    mir::inst::VarId::VarId((VarId *)this_00,in_stack_fffffffffffffd0c);
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)this_00,
               (value_type *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  }
  std::optional<mir::inst::VarId>::operator=
            ((optional<mir::inst::VarId> *)in_stack_fffffffffffffd20._M_current,
             &in_stack_fffffffffffffd18->first);
  return in_RDI;
}

Assistant:

std::vector<std::unique_ptr<mir::inst::Inst>> get_insts(
      int times, mir::inst::VarId& new_change_var) {
    std::vector<std::unique_ptr<mir::inst::Inst>> res;
    auto cond = mir::inst::VarId(0);
    for (int i = 0; i < times; i++) {
      var_map.clear();
      if (i) {
        var_map.insert(phi_var_pair);
      }
      for (auto& inst : blk.inst) {
        if (inst->inst_kind() != mir::inst::InstKind::Store) {
          copy_var(inst->dest);
        }
      }
      for (auto& inst : blk.inst) {
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          if (i == 0) {
            auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
            auto& i = *ptr;
            auto phi = dynamic_cast<mir::inst::PhiInst*>(&i);
            phi->vars.erase(
                std::find(phi->vars.begin(), phi->vars.end(), change_var));
            ptr->dest = var_map.at(ptr->dest);
            res.push_back(std::move(ptr));
          }
          continue;
        } else {
          auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
          bool flag = inst->dest == change_var;
          for (auto var : ptr->useVars()) {
            if (var_map.count(var)) ptr->replace(var, var_map.at(var));
          }
          if (var_map.count(ptr->dest)) {
            ptr->dest = var_map.at(ptr->dest);
          }
          if (flag) {
            new_change_var = ptr->dest;
            phi_var_pair.second = ptr->dest;
          }
          if (inst->inst_kind() == mir::inst::InstKind::Op) {
            auto& i = *inst;
            auto opist = dynamic_cast<mir::inst::OpInst*>(&i);
            if (opist->op == mir::inst::Op::Lt) {
              cond = ptr->dest;
            }
          }
          res.push_back(std::move(ptr));
        }
      }
    }
    if (res.size()) {
      auto& inst = res.front();
      assert(inst->inst_kind() == mir::inst::InstKind::Phi);
      auto& i = *inst;
      auto phi = dynamic_cast<mir::inst::PhiInst*>(&i);
      phi->vars.push_back(mir::inst::VarId(new_change_var.id));
    }
    blk.jump.cond_or_ret = cond;
    return res;
  }